

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObject.cpp
# Opt level: O1

void __thiscall chrono::ChObj::ArchiveIN(ChObj *this,ChArchiveIn *marchive)

{
  char *local_38;
  string *local_30;
  undefined1 local_28;
  
  ChArchiveIn::VersionRead<chrono::ChObj>(marchive);
  local_30 = &this->m_name;
  local_38 = "m_name";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x40))(marchive,&local_38);
  local_30 = (string *)&this->m_identifier;
  local_38 = "m_identifier";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x18))(marchive,&local_38);
  local_30 = (string *)&this->ChTime;
  local_38 = "ChTime";
  local_28 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  return;
}

Assistant:

void ChObj::ArchiveIN(ChArchiveIn& marchive) {
    /*int version =*/ marchive.VersionRead<ChObj>();

    // stream out all member data
    marchive >> CHNVP(m_name);
    marchive >> CHNVP(m_identifier);
    marchive >> CHNVP(ChTime);
}